

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::StructuredAssignmentPatternExpression::forStruct
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  char *pcVar1;
  SyntaxKind kind;
  undefined4 uVar2;
  size_t sVar3;
  SyntaxNode *pSVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  ParentList *targetField;
  bool bVar8;
  int iVar9;
  AssignmentPatternItemSyntax *pAVar10;
  Symbol *pSVar11;
  Type *this;
  Type *pTVar12;
  Expression *pEVar13;
  Diagnostic *pDVar14;
  undefined4 extraout_var;
  uint32_t extraout_var_00;
  undefined4 extraout_var_01;
  StructuredAssignmentPatternExpression *expr;
  ulong uVar15;
  specific_symbol_iterator<slang::ast::FieldSymbol> extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint uVar17;
  StructuredAssignmentPatternExpression *ctx;
  SourceLocation args;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  FieldSymbol *field;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  SourceRange SVar28;
  string_view name;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar29;
  string_view name_00;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffd28;
  try_emplace_args_t local_2b9;
  SourceLocation local_2b8;
  const_iterator __begin2;
  Expression *defaultSetter;
  Token nameToken;
  Symbol *member;
  __extent_storage<18446744073709551615UL> _Stack_270;
  StructuredAssignmentPatternExpression *local_268;
  long local_260;
  Scope *local_258;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_250;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  memberMap;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL> memberSetters;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar16;
  
  defaultSetter = (Expression *)0x0;
  local_268 = (StructuredAssignmentPatternExpression *)type;
  local_258 = structScope;
  SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  ::SmallMap(&memberMap);
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.data_ =
       (pointer)memberSetters.
                super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                .firstElement;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.len = 0;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  data_ = (pointer)typeSetters.
                   super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                   .firstElement;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  len = 0;
  __begin2.index = 0;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.cap = 4;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  cap = 4;
  sVar3 = (syntax->items).elements._M_extent._M_extent_value;
  bVar21 = 0;
  local_2b8 = (SourceLocation)context;
  __begin2.list = &syntax->items;
  do {
    if ((__begin2.list == &syntax->items) && (__begin2.index == sVar3 + 1 >> 1)) {
      elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
      elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
      sVar29 = Scope::membersOfType<slang::ast::FieldSymbol>(local_258);
      sVar16 = sVar29._M_end.current;
      do {
        __begin2.list = (ParentList *)sVar29._M_begin.current;
        targetField = __begin2.list;
        if ((Symbol *)__begin2.list == sVar16.current) {
          iVar9 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::
                  copy(&memberSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                       ,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)sVar29._M_end.current.current);
          __begin2.list = (ParentList *)CONCAT44(extraout_var,iVar9);
          nameToken._0_4_ =
               SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                         (&typeSetters.
                           super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                          ,(EVP_PKEY_CTX *)comp,src);
          nameToken.rawLen = extraout_var_00;
          member = (Symbol *)0x0;
          _Stack_270._M_extent_value = 0;
          iVar9 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                            (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                             (EVP_PKEY_CTX *)comp,src_00);
          local_250._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar9);
          ctx = local_268;
          expr = BumpAllocator::
                 emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                           (&comp->super_BumpAllocator,(Type *)local_268,
                            (span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                             *)&__begin2,
                            (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                             *)&nameToken,
                            (span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
                             *)&member,&defaultSetter,&local_250,&sourceRange);
          if (bVar21 != 0) {
            ctx = expr;
            expr = (StructuredAssignmentPatternExpression *)
                   Expression::badExpr(comp,(Expression *)expr);
          }
          SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                    (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                     (EVP_PKEY_CTX *)ctx);
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::cleanup
                    (&typeSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                     ,(EVP_PKEY_CTX *)ctx);
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::cleanup
                    (&memberSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                     ,(EVP_PKEY_CTX *)ctx);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
          ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                         *)&memberMap.super_Storage.field_0x88);
          return (Expression *)expr;
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = __begin2.list;
        uVar15 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar19 = uVar15 >> (memberMap._144_1_ & 0x3f);
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        uVar20 = 0;
        do {
          pcVar1 = (char *)(memberMap._160_8_ + uVar19 * 0x10);
          cVar22 = (char)uVar2;
          auVar27[0] = -(*pcVar1 == cVar22);
          cVar23 = (char)((uint)uVar2 >> 8);
          auVar27[1] = -(pcVar1[1] == cVar23);
          cVar24 = (char)((uint)uVar2 >> 0x10);
          auVar27[2] = -(pcVar1[2] == cVar24);
          bVar25 = (byte)((uint)uVar2 >> 0x18);
          auVar27[3] = -(pcVar1[3] == bVar25);
          auVar27[4] = -(pcVar1[4] == cVar22);
          auVar27[5] = -(pcVar1[5] == cVar23);
          auVar27[6] = -(pcVar1[6] == cVar24);
          auVar27[7] = -(pcVar1[7] == bVar25);
          auVar27[8] = -(pcVar1[8] == cVar22);
          auVar27[9] = -(pcVar1[9] == cVar23);
          auVar27[10] = -(pcVar1[10] == cVar24);
          auVar27[0xb] = -(pcVar1[0xb] == bVar25);
          auVar27[0xc] = -(pcVar1[0xc] == cVar22);
          auVar27[0xd] = -(pcVar1[0xd] == cVar23);
          auVar27[0xe] = -(pcVar1[0xe] == cVar24);
          auVar27[0xf] = -(pcVar1[0xf] == bVar25);
          uVar17 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
          if (uVar17 != 0) {
            lVar18 = memberMap._168_8_ + uVar19 * 0xf0;
            do {
              iVar9 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                }
              }
              if (__begin2.list == *(ParentList **)(lVar18 + (ulong)(uint)(iVar9 << 4))) {
                SmallVectorBase<slang::ast::Expression_const*>::
                emplace_back<slang::ast::Expression_const*const&>
                          ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                           (Expression **)(lVar18 + (ulong)(uint)(iVar9 << 4) + 8));
                bVar25 = bVar21;
                goto LAB_0043208e;
              }
              uVar17 = uVar17 - 1 & uVar17;
            } while (uVar17 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & pcVar1[0xf]) == 0)
          break;
          lVar18 = uVar19 + uVar20;
          uVar20 = uVar20 + 1;
          uVar19 = lVar18 + 1U & memberMap._152_8_;
        } while (uVar20 <= (ulong)memberMap._152_8_);
        pTVar12 = DeclaredType::getType
                            ((DeclaredType *)&__begin2.list[1].super_SyntaxListBase.super_SyntaxNode
                            );
        bVar8 = Type::isError(pTVar12);
        bVar25 = 1;
        if ((!bVar8) && (*(long *)&(targetField->super_SyntaxListBase).super_SyntaxNode != 0)) {
          typeSetters_00._M_extent._M_extent_value =
               typeSetters.
               super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
               len;
          typeSetters_00._M_ptr =
               typeSetters.
               super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
               data_;
          nameToken._0_8_ =
               matchElementValue((ASTContext *)local_2b8,pTVar12,(FieldSymbol *)targetField,
                                 sourceRange,typeSetters_00,defaultSetter);
          if ((Expression *)nameToken._0_8_ == (Expression *)0x0) {
            bVar25 = 1;
          }
          else {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                       (Expression **)&nameToken);
            bVar25 = bVar21;
          }
        }
LAB_0043208e:
        bVar21 = bVar25;
        Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment
                  ((specific_symbol_iterator<slang::ast::FieldSymbol> *)&__begin2);
        sVar29._M_end.current = extraout_RDX.current;
        sVar29._M_begin.current = (Symbol *)__begin2.list;
      } while( true );
    }
    pAVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssignmentPatternItemSyntax>::
              iterator_base<const_slang::syntax::AssignmentPatternItemSyntax_*>::dereference
                        (&__begin2);
    pSVar4 = &((pAVar10->key).ptr)->super_SyntaxNode;
    kind = pSVar4->kind;
    if (kind == IdentifierName) {
      nameToken._0_8_ = *(undefined8 *)(pSVar4 + 1);
      nameToken.info = (Info *)pSVar4[1].parent;
      name = parsing::Token::valueText(&nameToken);
      name_00._M_len = name._M_str;
      if ((Scope *)name._M_len == (Scope *)0x0) {
        bVar21 = 1;
      }
      else {
        pSVar11 = Scope::find(local_258,name);
        member = pSVar11;
        if (pSVar11 == (Symbol *)0x0) {
          name_00._M_str = (char *)0x1;
          pSVar11 = Lookup::unqualified(*(Lookup **)context,(Scope *)name._M_len,name_00,
                                        (bitmask<slang::ast::LookupFlags>)
                                        (underlying_type)structScope);
          if ((pSVar11 == (Symbol *)0x0) || (bVar8 = Symbol::isType(pSVar11), !bVar8)) {
            SVar28 = slang::syntax::SyntaxNode::sourceRange(&((pAVar10->key).ptr)->super_SyntaxNode)
            ;
            pDVar14 = ASTContext::addDiag((ASTContext *)local_2b8,(DiagCode)0x3a000a,SVar28);
            Diagnostic::operator<<(pDVar14,name);
            bVar21 = 1;
            ast::operator<<(pDVar14,(Type *)local_268);
            context = (ASTContext *)local_2b8;
          }
          else {
            pTVar12 = (Type *)(pAVar10->expr).ptr;
            SVar28 = parsing::Token::range(&nameToken);
            assignmentRange_00.endLoc = local_2b8;
            assignmentRange_00.startLoc = SVar28.endLoc;
            structScope = (Scope *)local_2b8;
            pEVar13 = Expression::bindRValue
                                ((Expression *)pSVar11,pTVar12,(ExpressionSyntax *)SVar28.startLoc,
                                 assignmentRange_00,(ASTContext *)0x0,in_stack_fffffffffffffd28);
            bVar8 = Expression::bad(pEVar13);
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pSVar11;
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = (size_type)pEVar13;
            SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
            emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      (&typeSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                       ,(TypeSetter *)&elements);
            bVar21 = bVar21 | bVar8;
            context = (ASTContext *)local_2b8;
          }
        }
        else {
          this = DeclaredType::getType((DeclaredType *)(pSVar11 + 1));
          pTVar12 = (Type *)(pAVar10->expr).ptr;
          SVar28 = parsing::Token::range(&nameToken);
          assignmentRange.endLoc = local_2b8;
          assignmentRange.startLoc = SVar28.endLoc;
          pEVar13 = Expression::bindRValue
                              ((Expression *)this,pTVar12,(ExpressionSyntax *)SVar28.startLoc,
                               assignmentRange,(ASTContext *)0x0,in_stack_fffffffffffffd28);
          bVar8 = Expression::bad(pEVar13);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = member;
          structScope = (Scope *)(SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                                 SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0));
          uVar15 = (ulong)structScope >> (memberMap._144_1_ & 0x3f);
          bVar21 = bVar21 | bVar8;
          uVar2 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[(ulong)structScope & 0xff];
          uVar20 = 0;
          uVar19 = uVar15;
          do {
            pcVar1 = (char *)(memberMap._160_8_ + uVar19 * 0x10);
            cVar22 = (char)uVar2;
            auVar26[0] = -(*pcVar1 == cVar22);
            cVar23 = (char)((uint)uVar2 >> 8);
            auVar26[1] = -(pcVar1[1] == cVar23);
            cVar24 = (char)((uint)uVar2 >> 0x10);
            auVar26[2] = -(pcVar1[2] == cVar24);
            bVar25 = (byte)((uint)uVar2 >> 0x18);
            auVar26[3] = -(pcVar1[3] == bVar25);
            auVar26[4] = -(pcVar1[4] == cVar22);
            auVar26[5] = -(pcVar1[5] == cVar23);
            auVar26[6] = -(pcVar1[6] == cVar24);
            auVar26[7] = -(pcVar1[7] == bVar25);
            auVar26[8] = -(pcVar1[8] == cVar22);
            auVar26[9] = -(pcVar1[9] == cVar23);
            auVar26[10] = -(pcVar1[10] == cVar24);
            auVar26[0xb] = -(pcVar1[0xb] == bVar25);
            auVar26[0xc] = -(pcVar1[0xc] == cVar22);
            auVar26[0xd] = -(pcVar1[0xd] == cVar23);
            auVar26[0xe] = -(pcVar1[0xe] == cVar24);
            auVar26[0xf] = -(pcVar1[0xf] == bVar25);
            uVar17 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
            local_250._M_ptr = (pointer)pEVar13;
            if (uVar17 != 0) {
              local_260 = memberMap._168_8_ + uVar19 * 0xf0;
              do {
                iVar9 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                if (member == *(Symbol **)(local_260 + (ulong)(uint)(iVar9 << 4))) {
                  SVar28 = slang::syntax::SyntaxNode::sourceRange
                                     (&((pAVar10->key).ptr)->super_SyntaxNode);
                  pDVar14 = ASTContext::addDiag((ASTContext *)local_2b8,(DiagCode)0x100007,SVar28);
                  Diagnostic::operator<<(pDVar14,name);
                  bVar21 = 1;
                  Diagnostic::addNote(pDVar14,(DiagCode)0xa0001,
                                      *(SourceRange *)
                                       (*(long *)(local_260 + (ulong)(uint)(iVar9 << 4) + 8) + 0x20)
                                     );
                  context = (ASTContext *)local_2b8;
                  goto LAB_00431ea1;
                }
                uVar17 = uVar17 - 1 & uVar17;
              } while (uVar17 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)structScope & 7] & pcVar1[0xf]) ==
                0) break;
            lVar18 = uVar19 + uVar20;
            uVar20 = uVar20 + 1;
            uVar19 = lVar18 + 1U & memberMap._152_8_;
          } while (uVar20 <= (ulong)memberMap._152_8_);
          if ((ulong)memberMap._184_8_ < (ulong)memberMap._176_8_) {
            in_stack_fffffffffffffd28.m_bits = (underlying_type)&local_250;
            args = (SourceLocation)&local_2b9;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
            ::
            unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                      ((locator *)&elements,
                       (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                        *)&memberMap.super_Storage.field_0x88,uVar15,(size_t)structScope,
                       (try_emplace_args_t *)args,&member,
                       (Expression **)in_stack_fffffffffffffd28.m_bits);
          }
          else {
            args = (SourceLocation)&member;
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
            ::
            unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                      ((locator *)&elements,
                       (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                        *)&memberMap.super_Storage.field_0x88,(size_t)structScope,&local_2b9,
                       (Symbol **)args,(Expression **)&local_250);
          }
          elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)member;
          elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = (size_type)pEVar13;
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::
          emplace_back<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                    (&memberSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                     ,(MemberSetter *)&elements);
          context = (ASTContext *)local_2b8;
          structScope = (Scope *)args;
        }
      }
    }
    else if (kind == DefaultPatternKeyExpression) {
      if (defaultSetter != (Expression *)0x0) {
        SVar28 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
        bVar21 = 1;
        ASTContext::addDiag(context,(DiagCode)0xf0007,SVar28);
      }
      defaultSetter =
           Expression::selfDetermined
                     (comp,(pAVar10->expr).ptr,context,(bitmask<slang::ast::ASTFlags>)0x0);
      bVar8 = Expression::bad(defaultSetter);
      bVar21 = bVar21 | bVar8;
    }
    else {
      bVar8 = slang::syntax::DataTypeSyntax::isKind(kind);
      pSVar4 = &((pAVar10->key).ptr)->super_SyntaxNode;
      if (bVar8) {
        pTVar12 = Compilation::getType(comp,(DataTypeSyntax *)pSVar4,context,(Type *)0x0);
        bVar8 = Type::isSimpleType(pTVar12);
        if (bVar8) {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = context;
          pEVar13 = Expression::bindRValue
                              ((Expression *)pTVar12,(Type *)(pAVar10->expr).ptr,
                               (ExpressionSyntax *)0x0,(SourceRange)(auVar7 << 0x40),
                               (ASTContext *)0x0,in_stack_fffffffffffffd28);
          elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pTVar12;
          elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = (size_type)pEVar13;
          SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
          emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                    (&typeSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                     ,(TypeSetter *)&elements);
          structScope = (Scope *)context;
          bVar8 = Expression::bad(pEVar13);
          bVar21 = bVar21 | bVar8;
          context = (ASTContext *)local_2b8;
        }
        else {
          SVar28 = slang::syntax::SyntaxNode::sourceRange(&((pAVar10->key).ptr)->super_SyntaxNode);
          bVar21 = 1;
          ASTContext::addDiag(context,(DiagCode)0x120007,SVar28);
        }
      }
      else {
        SVar28 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
        bVar21 = 1;
        ASTContext::addDiag(context,(DiagCode)0x120007,SVar28);
      }
    }
LAB_00431ea1:
    __begin2.index = __begin2.index + 1;
  } while( true );
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forStruct(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<const Symbol*, const Expression*, 8> memberMap;
    SmallVector<MemberSetter, 4> memberSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
        }
        else if (item->key->kind == SyntaxKind::IdentifierName) {
            auto nameToken = item->key->as<IdentifierNameSyntax>().identifier;
            auto name = nameToken.valueText();
            if (name.empty()) {
                bad = true;
                continue;
            }

            const Symbol* member = structScope.find(name);
            if (member) {
                auto& expr = bindRValue(member->as<FieldSymbol>().getType(), *item->expr,
                                        nameToken.range(), context);
                bad |= expr.bad();

                auto [it, inserted] = memberMap.emplace(member, &expr);
                if (!inserted) {
                    auto& diag = context.addDiag(diag::AssignmentPatternKeyDupName,
                                                 item->key->sourceRange());
                    diag << name;
                    diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
                    bad = true;
                    continue;
                }

                memberSetters.emplace_back(MemberSetter{member, &expr});
            }
            else {
                auto found = Lookup::unqualified(*context.scope, name, LookupFlags::Type);
                if (found && found->isType()) {
                    auto& expr = bindRValue(found->as<Type>(), *item->expr, nameToken.range(),
                                            context);
                    bad |= expr.bad();

                    typeSetters.emplace_back(TypeSetter{&found->as<Type>(), &expr});
                }
                else {
                    auto& diag = context.addDiag(diag::UnknownMember, item->key->sourceRange());
                    diag << name;
                    diag << type;
                    bad = true;
                }
            }
        }
        else if (DataTypeSyntax::isKind(item->key->kind)) {
            const Type& typeKey = comp.getType(item->key->as<DataTypeSyntax>(), context);
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
            bad = true;
        }
    }

    SmallVector<const Expression*> elements;
    for (auto& field : structScope.membersOfType<FieldSymbol>()) {
        // If we already have a setter for this field we don't have to do anything else.
        if (auto it = memberMap.find(&field); it != memberMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        const Type& fieldType = field.getType();
        if (fieldType.isError() || field.name.empty()) {
            bad = true;
            continue;
        }

        auto expr = matchElementValue(context, fieldType, &field, sourceRange, typeSetters,
                                      defaultSetter);
        if (!expr) {
            bad = true;
            continue;
        }

        elements.push_back(expr);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, memberSetters.copy(comp), typeSetters.copy(comp), std::span<const IndexSetter>{},
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}